

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::setupViewport(QGraphicsView *this,QWidget *widget)

{
  QPointer *this_00;
  uint uVar1;
  long lVar2;
  undefined1 uVar3;
  bool bVar4;
  long lVar5;
  QList<Qt::GestureType> *__range2;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<Qt::GestureType> local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,"QGraphicsView::setupViewport: cannot initialize null widget");
  }
  else {
    lVar2 = *(long *)(this + 8);
    lVar5 = (**(code **)(*(long *)widget + 8))(widget,"QOpenGLWidget");
    *(uint *)(lVar2 + 0x300) = *(uint *)(lVar2 + 0x300) & 0xffffffbf | (uint)(lVar5 == 0) << 6;
    QWidget::setFocusPolicy(widget,StrongFocus);
    if (lVar5 == 0) {
      QWidget::setAutoFillBackground(widget,true);
    }
    else {
      uVar3 = (**(code **)(**(long **)&widget->field_0x8 + 0x98))();
      *(undefined1 *)(lVar2 + 0x48c) = uVar3;
    }
    this_00 = (QPointer *)(lVar2 + 0x490);
    bVar4 = QPointer::operator_cast_to_bool(this_00);
    if ((((bVar4) &&
         ((uVar1 = *(uint *)(*(long *)(*(long *)(lVar2 + 0x498) + 8) + 0xb8),
          (uVar1 >> 0xc & 1) == 0 || ((uVar1 >> 0xd & 1) == 0)))) || (*(int *)(lVar2 + 0x47c) == 2))
       || (*(int *)(lVar2 + 0x480) == 2)) {
      QWidget::setMouseTracking(widget,true);
    }
    bVar4 = QPointer::operator_cast_to_bool(this_00);
    if ((bVar4) && ((*(byte *)(*(long *)(*(long *)(lVar2 + 0x498) + 8) + 0xba) & 1) == 0)) {
      QWidget::setAttribute(widget,WA_AcceptTouchEvents,true);
    }
    bVar4 = QPointer::operator_cast_to_bool(this_00);
    if (bVar4) {
      local_58.size._0_4_ = 0xaaaaaaaa;
      local_58.size._4_4_ = 0xaaaaaaaa;
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      QHash<Qt::GestureType,_int>::keys
                ((QList<Qt::GestureType> *)&local_58,
                 (QHash<Qt::GestureType,_int> *)(*(long *)(*(long *)(lVar2 + 0x498) + 8) + 0x368));
      lVar2 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      lVar5 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
      for (lVar6 = 0; lVar5 << 2 != lVar6; lVar6 = lVar6 + 4) {
        QWidget::grabGesture(widget,*(GestureType *)(lVar2 + lVar6),(GestureFlags)0x0);
      }
      QArrayDataPointer<Qt::GestureType>::~QArrayDataPointer(&local_58);
    }
    bVar4 = QWidget::acceptDrops((QWidget *)this);
    QWidget::setAcceptDrops(widget,bVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setupViewport(QWidget *widget)
{
    Q_D(QGraphicsView);

    if (!widget) {
        qWarning("QGraphicsView::setupViewport: cannot initialize null widget");
        return;
    }

    const bool isGLWidget = widget->inherits("QOpenGLWidget");

    d->accelerateScrolling = !(isGLWidget);

    widget->setFocusPolicy(Qt::StrongFocus);

    if (isGLWidget)
        d->stereoEnabled = QWidgetPrivate::get(widget)->isStereoEnabled();

    if (!isGLWidget) {
        // autoFillBackground enables scroll acceleration.
        widget->setAutoFillBackground(true);
    }

    // We are only interested in mouse tracking if items
    // accept hover events or use non-default cursors or if
    // AnchorUnderMouse is used as transformation or resize anchor.
    if ((d->scene && (!d->scene->d_func()->allItemsIgnoreHoverEvents
                     || !d->scene->d_func()->allItemsUseDefaultCursor))
        || d->transformationAnchor == AnchorUnderMouse
        || d->resizeAnchor == AnchorUnderMouse) {
        widget->setMouseTracking(true);
    }

    // enable touch events if any items is interested in them
    if (d->scene && !d->scene->d_func()->allItemsIgnoreTouchEvents)
        widget->setAttribute(Qt::WA_AcceptTouchEvents);

#ifndef QT_NO_GESTURES
    if (d->scene) {
        const auto gestures = d->scene->d_func()->grabbedGestures.keys();
        for (Qt::GestureType gesture : gestures)
            widget->grabGesture(gesture);
    }
#endif

    widget->setAcceptDrops(acceptDrops());
}